

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP3Writer::DoPutSync(BP3Writer *this,Variable<float> *variable,float *data)

{
  int iVar1;
  ScopedTimer *in_RDX;
  BP3Writer *in_RDI;
  ScopedTimer __var2167;
  bool in_stack_000000ff;
  BPInfo *in_stack_00000100;
  Variable<float> *in_stack_00000108;
  BP3Writer *in_stack_00000110;
  size_t in_stack_00000158;
  size_t in_stack_00000160;
  float *in_stack_00000168;
  Variable<float> *in_stack_00000170;
  void *in_stack_ffffffffffffffa8;
  ScopedTimer *in_stack_ffffffffffffffb0;
  
  if (DoPutSync(adios2::core::Variable<float>&,float_const*)::__var167 == '\0') {
    iVar1 = __cxa_guard_acquire(&DoPutSync(adios2::core::Variable<float>&,float_const*)::__var167);
    if (iVar1 != 0) {
      DoPutSync::__var167 = (void *)ps_timer_create_("BP3Writer::Put");
      __cxa_guard_release(&DoPutSync(adios2::core::Variable<float>&,float_const*)::__var167);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  CurrentStep(in_RDI);
  Variable<float>::SetBlockInfo
            (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158);
  PutSyncCommon<float>(in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000ff);
  std::
  vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
  ::pop_back((vector<adios2::core::Variable<float>::BPInfo,_std::allocator<adios2::core::Variable<float>::BPInfo>_>
              *)0xa00372);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(in_RDX);
  return;
}

Assistant:

void BP3Writer::InitParameters()
{
    m_BP3Serializer.Init(m_IO.m_Parameters, "in call to BP3::Open for writing");
    m_BP3Serializer.ResizeBuffer(m_BP3Serializer.m_Parameters.InitialBufferSize,
                                 "in call to BP3::Open to write");
}